

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint32_t flags;
  Address data_size;
  void *data;
  uint local_44;
  uint local_40;
  undefined4 uStack_3c;
  void *local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9c])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&this->num_data_segments_,"data segment count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9d])
                        (this->delegate_,(ulong)this->num_data_segments_);
      if (iVar1 == 0) {
        if (this->data_count_ == this->num_data_segments_ || this->data_count_ == 0xffffffff) {
          if (this->num_data_segments_ != 0) {
            uVar5 = 0;
            do {
              RVar2 = ReadU32Leb128(this,&local_44,"data segment flags");
              if (RVar2.enum_ == Error) {
                return (Result)Error;
              }
              uVar4 = (ulong)local_44;
              uVar3 = 0;
              if (local_44 == 0) {
                uVar4 = 0;
              }
              else {
                if ((this->options_->features).bulk_memory_enabled_ != true) {
                  pcVar6 = "invalid memory index %d: bulk memory not allowed";
LAB_001267dc:
                  PrintError(this,pcVar6);
                  return (Result)Error;
                }
                if (7 < local_44) {
                  pcVar6 = "invalid data segment flags: %#x";
                  goto LAB_001267dc;
                }
                if ((local_44 & 2) != 0) {
                  RVar2 = ReadU32Leb128(this,&local_40,"data segment memory index");
                  if (RVar2.enum_ == Error) {
                    return (Result)Error;
                  }
                  uVar4 = (ulong)local_44;
                  uVar3 = local_40;
                }
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9e])
                                (this->delegate_,(ulong)uVar5,(ulong)uVar3,uVar4 & 0xff);
              if (iVar1 != 0) {
                pcVar6 = "BeginDataSegment callback failed";
                goto LAB_00126792;
              }
              if ((local_44 & 1) == 0) {
                uVar3 = uVar5;
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9f])();
                if (iVar1 != 0) {
                  pcVar6 = "BeginDataSegmentInitExpr callback failed";
                  goto LAB_00126792;
                }
                RVar2 = ReadInitExpr(this,uVar3);
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa0])
                                  (this->delegate_,(ulong)uVar5);
                if (iVar1 != 0) {
                  pcVar6 = "EndDataSegmentInitExpr callback failed";
                  goto LAB_00126792;
                }
              }
              RVar2 = ReadBytes(this,&local_38,(Address *)&local_40,"data segment data");
              if (RVar2.enum_ == Error) {
                return (Result)Error;
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa1])
                                (this->delegate_,(ulong)uVar5,local_38,CONCAT44(uStack_3c,local_40))
              ;
              if (iVar1 != 0) {
                pcVar6 = "OnDataSegmentData callback failed";
                goto LAB_00126792;
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa2])
                                (this->delegate_,(ulong)uVar5);
              if (iVar1 != 0) {
                pcVar6 = "EndDataSegment callback failed";
                goto LAB_00126792;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < this->num_data_segments_);
          }
          iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa3])();
          if (iVar1 == 0) {
            return (Result)Ok;
          }
          pcVar6 = "EndDataSection callback failed";
        }
        else {
          pcVar6 = "data segment count does not equal count in DataCount section";
        }
      }
      else {
        pcVar6 = "OnDataSegmentCount callback failed";
      }
LAB_00126792:
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginDataSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  CHECK_RESULT(ReadCount(&num_data_segments_, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments_);
  // If the DataCount section is not present, then data_count_ will be invalid.
  ERROR_UNLESS(
      data_count_ == kInvalidIndex || data_count_ == num_data_segments_,
      "data segment count does not equal count in DataCount section");
  for (Index i = 0; i < num_data_segments_; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "data segment flags"));
    ERROR_IF(flags != 0 && !options_.features.bulk_memory_enabled(),
             "invalid memory index %d: bulk memory not allowed", flags);
    ERROR_IF(flags > SegFlagMax, "invalid data segment flags: %#x", flags);
    Index memory_index(0);
    if (flags & SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags);
    if (!(flags & SegPassive)) {
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}